

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O1

void __thiscall Refal2::CQualifierBuilder::AddD(CQualifierBuilder *this)

{
  _WordT *p_Var1;
  ulong *puVar2;
  size_t __i;
  long lVar3;
  bitset<128UL> __result;
  _WordT local_10 [2];
  
  if (this->negative == true) {
    __result.super__Base_bitset<2UL>._M_w[0] = AnsiD;
    __result.super__Base_bitset<2UL>._M_w[1] = DAT_00149308;
    lVar3 = 0;
    do {
      p_Var1 = __result.super__Base_bitset<2UL>._M_w + lVar3;
      *p_Var1 = ~*p_Var1;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    lVar3 = 0;
    do {
      p_Var1 = __result.super__Base_bitset<2UL>._M_w + lVar3;
      *p_Var1 = *p_Var1 | (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    lVar3 = 0;
    do {
      p_Var1 = (this->ansichars).super__Base_bitset<2UL>._M_w + lVar3;
      *p_Var1 = *p_Var1 & __result.super__Base_bitset<2UL>._M_w[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
  }
  else {
    __result.super__Base_bitset<2UL>._M_w[0] =
         (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[0];
    __result.super__Base_bitset<2UL>._M_w[1] =
         (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[1];
    lVar3 = 0;
    do {
      p_Var1 = __result.super__Base_bitset<2UL>._M_w + lVar3;
      *p_Var1 = ~*p_Var1;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_10[0] = __result.super__Base_bitset<2UL>._M_w[0];
    local_10[1] = __result.super__Base_bitset<2UL>._M_w[1];
    __result.super__Base_bitset<2UL>._M_w[0] = AnsiD;
    __result.super__Base_bitset<2UL>._M_w[1] = DAT_00149308;
    lVar3 = 0;
    do {
      p_Var1 = __result.super__Base_bitset<2UL>._M_w + lVar3;
      *p_Var1 = *p_Var1 & local_10[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    lVar3 = 0;
    do {
      p_Var1 = (this->ansichars).super__Base_bitset<2UL>._M_w + lVar3;
      *p_Var1 = *p_Var1 | __result.super__Base_bitset<2UL>._M_w[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
  }
  lVar3 = 0;
  do {
    puVar2 = (ulong *)((long)(this->ansicharsFixed).super__Base_bitset<2UL>._M_w + lVar3);
    *puVar2 = *puVar2 | *(ulong *)((long)&AnsiD + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 == 8);
  return;
}

Assistant:

void CQualifierBuilder::AddD()
{
	if( negative ) {
		ansichars &= ~AnsiD | ansicharsFixed;
	} else {
		ansichars |= AnsiD & ~ansicharsFixed;
	}
	ansicharsFixed |= AnsiD;
}